

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_group.hpp
# Opt level: O1

void __thiscall
oqpi::
sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::executeImpl(sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *this)

{
  bool bVar1;
  task_handle hTask;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  popTask((sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)&stack0xffffffffffffffe8);
  task_handle::validate((task_handle *)&stack0xffffffffffffffe8);
  LOCK();
  bVar1 = (local_18->grabbed_)._M_base._M_i == false;
  if (bVar1) {
    (local_18->grabbed_)._M_base._M_i = true;
  }
  UNLOCK();
  if (bVar1) {
    task_handle::execute((task_handle *)&stack0xffffffffffffffe8);
  }
  if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10._M_pi);
  }
  return;
}

Assistant:

virtual void executeImpl() override final
        {
            auto hTask = popTask();
            if (hTask.tryGrab())
            {
                hTask.execute();
            }
        }